

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

void FreeUserData(UserData data)

{
  undefined8 *in_RDI;
  int jz;
  int jx;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 0xf; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0xf; local_10 = local_10 + 1) {
      SUNDlsMat_destroyMat(in_RDI[(long)local_c * 0xf + (long)local_10 + 1]);
      SUNDlsMat_destroyMat(in_RDI[(long)local_c * 0xf + (long)local_10 + 0xe2]);
      SUNDlsMat_destroyArray(in_RDI[(long)local_c * 0xf + (long)local_10 + 0x1c3]);
    }
  }
  free((void *)*in_RDI);
  free(in_RDI);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jz;

  for (jx = 0; jx < MX; jx++)
  {
    for (jz = 0; jz < MZ; jz++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jz]);
      SUNDlsMat_destroyMat((data->Jbd)[jx][jz]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jz]);
    }
  }

  free(data->p);

  free(data);
}